

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O0

void __thiscall proto2_nofieldpresence_unittest::TestAllMapTypes::Clear(TestAllMapTypes *this)

{
  uint32_t cached_has_bits;
  TestAllMapTypes *this_local;
  
  google::protobuf::internal::MapFieldBase::Clear((MapFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_foreign_enum_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_foreign_message_);
  google::protobuf::internal::MapFieldBase::Clear
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_explicit_foreign_message_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllMapTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.map_int32_bytes_.Clear();
  _impl_.map_int32_foreign_enum_.Clear();
  _impl_.map_int32_foreign_message_.Clear();
  _impl_.map_int32_explicit_foreign_message_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}